

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O2

xml_attribute __thiscall pugi::xml_node::append_attribute(xml_node *this,char_t *name_)

{
  xml_node_struct *object;
  xml_attribute_struct *pxVar1;
  xml_attribute_struct *pxVar2;
  uint uVar3;
  xml_allocator *alloc;
  xml_attribute_struct *pxVar4;
  xml_attribute a;
  xml_attribute local_20;
  
  object = this->_root;
  if ((object == (xml_node_struct *)0x0) ||
     ((uVar3 = (uint)object->header & 0xf, uVar3 != 7 && (uVar3 != 2)))) {
    pxVar4 = (xml_attribute_struct *)0x0;
  }
  else {
    alloc = impl::anon_unknown_0::get_allocator<pugi::xml_node_struct>(object);
    pxVar4 = impl::anon_unknown_0::allocate_attribute(alloc);
    if (pxVar4 != (xml_attribute_struct *)0x0) {
      pxVar1 = this->_root->first_attribute;
      if (pxVar1 == (xml_attribute_struct *)0x0) {
        this->_root->first_attribute = pxVar4;
        pxVar1 = pxVar4;
      }
      else {
        pxVar2 = pxVar1->prev_attribute_c;
        pxVar2->next_attribute = pxVar4;
        pxVar4->prev_attribute_c = pxVar2;
      }
      pxVar1->prev_attribute_c = pxVar4;
      local_20._attr = pxVar4;
      xml_attribute::set_name(&local_20,name_);
    }
  }
  return (xml_attribute)pxVar4;
}

Assistant:

PUGI__FN xml_attribute xml_node::append_attribute(const char_t* name_)
	{
		if (!impl::allow_insert_attribute(type())) return xml_attribute();

		impl::xml_allocator& alloc = impl::get_allocator(_root);
		if (!alloc.reserve()) return xml_attribute();

		xml_attribute a(impl::allocate_attribute(alloc));
		if (!a) return xml_attribute();

		impl::append_attribute(a._attr, _root);

		a.set_name(name_);

		return a;
	}